

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryVaryingGeometryShaderTests.cpp
# Opt level: O2

TestCaseGroup * vkt::geometry::createVaryingGeometryShaderTests(TestContext *testCtx)

{
  int iVar1;
  TestCaseGroup *pTVar2;
  TestNode *node;
  long lVar3;
  string *description;
  bool bVar4;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  TestContext *local_48;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> varyingGroup;
  
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  local_48 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,"varying","Test varyings.");
  varyingGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar2;
  if (createVaryingGeometryShaderTests(tcu::TestContext&)::varyingTests == '\0') {
    iVar1 = __cxa_guard_acquire(&createVaryingGeometryShaderTests(tcu::TestContext&)::varyingTests);
    if (iVar1 != 0) {
      createVaryingGeometryShaderTests::varyingTests[0].vertexOutputs = VERTEXT_NO_OP;
      createVaryingGeometryShaderTests::varyingTests[0].geometryOutputs = GEOMETRY_ONE;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[0].name,
                 "vertex_no_op_geometry_out_1",&local_49);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[0].desc,
                 "vertex_no_op_geometry_out_1",&local_4a);
      createVaryingGeometryShaderTests::varyingTests[1].vertexOutputs = VERTEXT_ZERO;
      createVaryingGeometryShaderTests::varyingTests[1].geometryOutputs = GEOMETRY_ONE;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[1].name,
                 "vertex_out_0_geometry_out_1",&local_4b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[1].desc,
                 "vertex_out_0_geometry_out_1",&local_4c);
      createVaryingGeometryShaderTests::varyingTests[2].vertexOutputs = VERTEXT_ZERO;
      createVaryingGeometryShaderTests::varyingTests[2].geometryOutputs = GEOMETRY_TWO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[2].name,
                 "vertex_out_0_geometry_out_2",&local_4d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[2].desc,
                 "vertex_out_0_geometry_out_2",&local_4e);
      createVaryingGeometryShaderTests::varyingTests[3].vertexOutputs = VERTEXT_ONE;
      createVaryingGeometryShaderTests::varyingTests[3].geometryOutputs = GEOMETRY_ZERO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[3].name,
                 "vertex_out_1_geometry_out_0",&local_4f);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[3].desc,
                 "vertex_out_1_geometry_out_0",&local_50);
      createVaryingGeometryShaderTests::varyingTests[4].vertexOutputs = VERTEXT_ONE;
      createVaryingGeometryShaderTests::varyingTests[4].geometryOutputs = GEOMETRY_TWO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[4].name,
                 "vertex_out_1_geometry_out_2",&local_51);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[4].desc,
                 "vertex_out_1_geometry_out_2",&local_52);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createVaryingGeometryShaderTests(tcu::TestContext&)::varyingTests);
    }
  }
  lVar3 = 5;
  description = &createVaryingGeometryShaderTests::varyingTests[0].desc;
  while( true ) {
    pTVar2 = varyingGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    bVar4 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    if (bVar4) break;
    node = (TestNode *)operator_new(0xb8);
    TestCase::TestCase((TestCase *)node,local_48,description + -1,description);
    node->_vptr_TestNode = (_func_int **)&PTR__VaryingTest_00bf50d8;
    node[1]._vptr_TestNode = *(_func_int ***)((long)&description[-2].field_2 + 8);
    std::__cxx11::string::string((string *)&node[1].m_testCtx,(string *)(description + -1));
    std::__cxx11::string::string
              ((string *)(node[1].m_name.field_2._M_local_buf + 8),(string *)description);
    tcu::TestNode::addChild(&pTVar2->super_TestNode,node);
    description = (string *)&description[2]._M_string_length;
  }
  varyingGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&varyingGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar2;
}

Assistant:

TestCaseGroup* createVaryingGeometryShaderTests (TestContext& testCtx)
{
	MovePtr<TestCaseGroup> varyingGroup	(new TestCaseGroup(testCtx, "varying",  "Test varyings."));

	// varying
	{
		static const VaryingTestSpec varyingTests[] =
		{
			{ VERTEXT_NO_OP,	GEOMETRY_ONE,	"vertex_no_op_geometry_out_1", "vertex_no_op_geometry_out_1" },
			{ VERTEXT_ZERO,		GEOMETRY_ONE,	"vertex_out_0_geometry_out_1", "vertex_out_0_geometry_out_1" },
			{ VERTEXT_ZERO,		GEOMETRY_TWO,	"vertex_out_0_geometry_out_2", "vertex_out_0_geometry_out_2" },
			{ VERTEXT_ONE,		GEOMETRY_ZERO,	"vertex_out_1_geometry_out_0", "vertex_out_1_geometry_out_0" },
			{ VERTEXT_ONE,		GEOMETRY_TWO,	"vertex_out_1_geometry_out_2", "vertex_out_1_geometry_out_2" },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(varyingTests); ++ndx)
			varyingGroup->addChild(new VaryingTest(testCtx, varyingTests[ndx]));
	}

	return varyingGroup.release();
}